

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_analytic_mels.c
# Opt level: O2

int main(void)

{
  undefined8 *puVar1;
  int iVar2;
  int iVar3;
  long *returnvalue;
  void *returnvalue_00;
  undefined8 *returnvalue_01;
  double dVar4;
  double dVar5;
  int retval;
  SUNContext ctx;
  sunrealtype t;
  double local_a8;
  undefined8 uStack_a0;
  void *arkode_mem;
  long netf;
  long ncfn;
  long nni;
  long nje;
  long nsetups;
  long nfi;
  long nfe;
  long nst_a;
  long nst;
  sunrealtype lamda;
  long nfeLS;
  
  lamda = -100.0;
  arkode_mem = (void *)0x0;
  retval = SUNContext_Create(0,&ctx);
  iVar3 = 1;
  iVar2 = check_retval(&retval,"SUNContext_Create",1);
  if (iVar2 == 0) {
    puts("\nAnalytical ODE test problem:");
    printf("    lamda = %g\n",0xc059000000000000);
    printf("   reltol = %.1e\n",0x3eb0c6f7a0b5ed8d);
    printf("   abstol = %.1e\n\n",0x3ddb7cdfd9d7bdbb);
    returnvalue = (long *)N_VNew_Serial(1,ctx);
    iVar2 = check_retval(returnvalue,"N_VNew_Serial",0);
    if (iVar2 == 0) {
      N_VConst(0,returnvalue);
      returnvalue_00 = (void *)ARKStepCreate(0,0,f,returnvalue,ctx);
      arkode_mem = returnvalue_00;
      iVar2 = check_retval(returnvalue_00,"ARKStepCreate",0);
      if (iVar2 == 0) {
        retval = ARKStepGetNumRhsEvals(returnvalue_00,&lamda);
        iVar2 = check_retval(&retval,"ARKodeSetUserData",1);
        iVar3 = 1;
        if (iVar2 == 0) {
          retval = ARKodeSStolerances(0x3eb0c6f7a0b5ed8d,0x3ddb7cdfd9d7bdbb,returnvalue_00);
          iVar2 = check_retval(&retval,"ARKodeSStolerances",1);
          iVar3 = 1;
          if (iVar2 == 0) {
            returnvalue_01 = (undefined8 *)SUNLinSolNewEmpty(ctx);
            if (returnvalue_01 != (undefined8 *)0x0) {
              puVar1 = (undefined8 *)returnvalue_01[1];
              *puVar1 = MatrixEmbeddedLSType;
              puVar1[8] = MatrixEmbeddedLSSolve;
              puVar1[0xe] = MatrixEmbeddedLSFree;
              *returnvalue_01 = returnvalue_00;
            }
            iVar2 = check_retval(returnvalue_01,"MatrixEmbeddedLS",0);
            if (iVar2 == 0) {
              retval = ARKodeSetLinearSolver(returnvalue_00,returnvalue_01,0);
              iVar2 = check_retval(&retval,"ARKodeSetLinearSolver",1);
              iVar3 = 1;
              if (iVar2 == 0) {
                retval = ARKodeSetLinear(returnvalue_00,0);
                iVar2 = check_retval(&retval,"ARKodeSetLinear",1);
                iVar3 = 1;
                if (iVar2 == 0) {
                  t = 0.0;
                  puts("        t           u");
                  puts("   ---------------------");
                  dVar5 = 0.0;
                  local_a8 = 1.0;
                  while (1e-15 < 10.0 - dVar5) {
                    retval = ARKodeEvolve(local_a8,returnvalue_00,returnvalue,&t,1);
                    iVar3 = check_retval(&retval,"ARKodeEvolve",1);
                    if (iVar3 != 0) break;
                    printf("  %10.6f  %10.6f\n",t,**(undefined8 **)(*returnvalue + 0x10));
                    if (retval < 0) {
                      fwrite("Solver failure, stopping integration\n",0x25,1,_stderr);
                      break;
                    }
                    dVar4 = local_a8 + 1.0;
                    dVar5 = t;
                    local_a8 = 10.0;
                    if (dVar4 <= 10.0) {
                      local_a8 = dVar4;
                    }
                  }
                  puts("   ---------------------");
                  retval = ARKodeGetNumSteps(returnvalue_00,&nst);
                  check_retval(&retval,"ARKodeGetNumSteps",1);
                  retval = ARKodeGetNumStepAttempts(returnvalue_00,&nst_a);
                  check_retval(&retval,"ARKodeGetNumStepAttempts",1);
                  retval = ARKStepGetNumRhsEvals(returnvalue_00,&nfe,&nfi);
                  check_retval(&retval,"ARKStepGetNumRhsEvals",1);
                  retval = ARKodeGetNumLinSolvSetups(returnvalue_00,&nsetups);
                  check_retval(&retval,"ARKodeGetNumLinSolvSetups",1);
                  retval = ARKodeGetNumErrTestFails(returnvalue_00,&netf);
                  check_retval(&retval,"ARKodeGetNumErrTestFails",1);
                  retval = ARKodeGetNumNonlinSolvIters(returnvalue_00,&nni);
                  check_retval(&retval,"ARKodeGetNumNonlinSolvIters",1);
                  retval = ARKodeGetNumNonlinSolvConvFails(returnvalue_00,&ncfn);
                  check_retval(&retval,"ARKodeGetNumNonlinSolvConvFails",1);
                  retval = ARKodeGetNumJacEvals(returnvalue_00,&nje);
                  check_retval(&retval,"ARKodeGetNumJacEvals",1);
                  retval = ARKodeGetNumLinRhsEvals(returnvalue_00,&nfeLS);
                  check_retval(&retval,"ARKodeGetNumLinRhsEvals",1);
                  puts("\nFinal Solver Statistics:");
                  printf("   Internal solver steps = %li (attempted = %li)\n",nst,nst_a);
                  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n",nfe,nfi);
                  printf("   Total linear solver setups = %li\n",nsetups);
                  printf("   Total RHS evals for setting up the linear system = %li\n",nfeLS);
                  printf("   Total number of Jacobian evaluations = %li\n",nje);
                  printf("   Total number of Newton iterations = %li\n",nni);
                  printf("   Total number of linear solver convergence failures = %li\n",ncfn);
                  printf("   Total number of error test failures = %li\n\n",netf);
                  dVar5 = atan(t);
                  dVar5 = ABS(**(double **)(*returnvalue + 0x10) - dVar5) *
                          (1.0 / (ABS(dVar5) * 1e-06 + 1e-10));
                  if (1.0 <= dVar5) {
                    uStack_a0 = 0;
                    local_a8 = dVar5;
                    fprintf(_stdout,"\nSUNDIALS_WARNING: check_ans error=%g\n\n",dVar5);
                    dVar5 = local_a8;
                  }
                  retval = (int)(1.0 <= dVar5);
                  N_VDestroy(returnvalue);
                  ARKodeFree(&arkode_mem);
                  SUNLinSolFree(returnvalue_01);
                  SUNContext_Free(&ctx);
                  iVar3 = retval;
                }
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int main(void)
{
  /* general problem parameters */
  sunrealtype T0     = SUN_RCONST(0.0);    /* initial time */
  sunrealtype Tf     = SUN_RCONST(10.0);   /* final time */
  sunrealtype dTout  = SUN_RCONST(1.0);    /* time between outputs */
  sunindextype NEQ   = 1;                  /* number of dependent vars. */
  sunrealtype reltol = SUN_RCONST(1.0e-6); /* tolerances */
  sunrealtype abstol = SUN_RCONST(1.0e-10);
  sunrealtype lamda  = SUN_RCONST(-100.0); /* stiffness parameter */

  /* general problem variables */
  int retval;                /* reusable error-checking flag */
  N_Vector y         = NULL; /* empty vector for storing solution */
  SUNLinearSolver LS = NULL; /* empty linear solver object */
  void* arkode_mem   = NULL; /* empty ARKODE memory structure */
  sunrealtype t, tout;
  long int nst, nst_a, nfe, nfi, nsetups, nje, nfeLS, nni, ncfn, netf;

  /* Create the SUNDIALS context object for this simulation */
  SUNContext ctx;
  retval = SUNContext_Create(SUN_COMM_NULL, &ctx);
  if (check_retval(&retval, "SUNContext_Create", 1)) { return 1; }

  /* Initial diagnostics output */
  printf("\nAnalytical ODE test problem:\n");
  printf("    lamda = %" GSYM "\n", lamda);
  printf("   reltol = %.1" ESYM "\n", reltol);
  printf("   abstol = %.1" ESYM "\n\n", abstol);

  /* Initialize data structures */
  y = N_VNew_Serial(NEQ, ctx); /* Create serial vector for solution */
  if (check_retval((void*)y, "N_VNew_Serial", 0)) { return 1; }
  N_VConst(SUN_RCONST(0.0), y); /* Specify initial condition */

  /* Call ARKStepCreate to initialize the ARK timestepper module and
     specify the right-hand side function in y'=f(t,y), the inital time
     T0, and the initial dependent variable vector y.  Note: since this
     problem is fully implicit, we set f_E to NULL and f_I to f. */
  arkode_mem = ARKStepCreate(NULL, f, T0, y, ctx);
  if (check_retval((void*)arkode_mem, "ARKStepCreate", 0)) { return 1; }

  /* Set routines */
  retval = ARKodeSetUserData(arkode_mem,
                             (void*)&lamda); /* Pass lamda to user functions */
  if (check_retval(&retval, "ARKodeSetUserData", 1)) { return 1; }
  retval = ARKodeSStolerances(arkode_mem, reltol, abstol); /* Specify tolerances */
  if (check_retval(&retval, "ARKodeSStolerances", 1)) { return 1; }

  /* Initialize custom matrix-embedded linear solver */
  LS = MatrixEmbeddedLS(arkode_mem, ctx);
  if (check_retval((void*)LS, "MatrixEmbeddedLS", 0)) { return 1; }
  retval = ARKodeSetLinearSolver(arkode_mem, LS, NULL); /* Attach linear solver */
  if (check_retval(&retval, "ARKodeSetLinearSolver", 1)) { return 1; }

  /* Specify linearly implicit RHS, with non-time-dependent Jacobian */
  retval = ARKodeSetLinear(arkode_mem, 0);
  if (check_retval(&retval, "ARKodeSetLinear", 1)) { return 1; }

  /* Main time-stepping loop: calls ARKodeEvolve to perform the integration, then
     prints results.  Stops when the final time has been reached. */
  t    = T0;
  tout = T0 + dTout;
  printf("        t           u\n");
  printf("   ---------------------\n");
  while (Tf - t > 1.0e-15)
  {
    retval = ARKodeEvolve(arkode_mem, tout, y, &t, ARK_NORMAL); /* call integrator */
    if (check_retval(&retval, "ARKodeEvolve", 1)) { break; }
    printf("  %10.6" FSYM "  %10.6" FSYM "\n", t,
           NV_Ith_S(y, 0)); /* access/print solution */
    if (retval >= 0)
    { /* successful solve: update time */
      tout += dTout;
      tout = (tout > Tf) ? Tf : tout;
    }
    else
    { /* unsuccessful solve: break */
      fprintf(stderr, "Solver failure, stopping integration\n");
      break;
    }
  }
  printf("   ---------------------\n");

  /* Get/print some final statistics on how the solve progressed */
  retval = ARKodeGetNumSteps(arkode_mem, &nst);
  check_retval(&retval, "ARKodeGetNumSteps", 1);
  retval = ARKodeGetNumStepAttempts(arkode_mem, &nst_a);
  check_retval(&retval, "ARKodeGetNumStepAttempts", 1);
  retval = ARKStepGetNumRhsEvals(arkode_mem, &nfe, &nfi);
  check_retval(&retval, "ARKStepGetNumRhsEvals", 1);
  retval = ARKodeGetNumLinSolvSetups(arkode_mem, &nsetups);
  check_retval(&retval, "ARKodeGetNumLinSolvSetups", 1);
  retval = ARKodeGetNumErrTestFails(arkode_mem, &netf);
  check_retval(&retval, "ARKodeGetNumErrTestFails", 1);
  retval = ARKodeGetNumNonlinSolvIters(arkode_mem, &nni);
  check_retval(&retval, "ARKodeGetNumNonlinSolvIters", 1);
  retval = ARKodeGetNumNonlinSolvConvFails(arkode_mem, &ncfn);
  check_retval(&retval, "ARKodeGetNumNonlinSolvConvFails", 1);
  retval = ARKodeGetNumJacEvals(arkode_mem, &nje);
  check_retval(&retval, "ARKodeGetNumJacEvals", 1);
  retval = ARKodeGetNumLinRhsEvals(arkode_mem, &nfeLS);
  check_retval(&retval, "ARKodeGetNumLinRhsEvals", 1);

  printf("\nFinal Solver Statistics:\n");
  printf("   Internal solver steps = %li (attempted = %li)\n", nst, nst_a);
  printf("   Total RHS evals:  Fe = %li,  Fi = %li\n", nfe, nfi);
  printf("   Total linear solver setups = %li\n", nsetups);
  printf("   Total RHS evals for setting up the linear system = %li\n", nfeLS);
  printf("   Total number of Jacobian evaluations = %li\n", nje);
  printf("   Total number of Newton iterations = %li\n", nni);
  printf("   Total number of linear solver convergence failures = %li\n", ncfn);
  printf("   Total number of error test failures = %li\n\n", netf);

  /* check the solution error */
  retval = check_ans(y, t, reltol, abstol);

  /* Clean up and return */
  N_VDestroy(y);           /* Free y vector */
  ARKodeFree(&arkode_mem); /* Free integrator memory */
  SUNLinSolFree(LS);       /* Free linear solver */
  SUNContext_Free(&ctx);   /* Free the SUNContext */

  return retval;
}